

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O3

void Io_BlifSplitIntoTokens(Vec_Ptr_t *vTokens,char *pLine,char Stop)

{
  byte *pbVar1;
  byte bVar2;
  char *pOutput;
  char *pCur;
  
  bVar2 = *pLine;
  pOutput = pLine;
  while (bVar2 != Stop) {
    if ((bVar2 < 0x21) && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      *pOutput = '\0';
    }
    pbVar1 = (byte *)(pOutput + 1);
    pOutput = pOutput + 1;
    bVar2 = *pbVar1;
  }
  Io_BlifCollectTokens(vTokens,pLine,pOutput);
  return;
}

Assistant:

static void Io_BlifSplitIntoTokens( Vec_Ptr_t * vTokens, char * pLine, char Stop )
{
    char * pCur;
    // clear spaces
    for ( pCur = pLine; *pCur != Stop; pCur++ )
        if ( Io_BlifCharIsSpace(*pCur) )
            *pCur = 0;
    // collect tokens
    Io_BlifCollectTokens( vTokens, pLine, pCur );
}